

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O0

void __thiscall
helics::EndpointInfo::addDestination
          (EndpointInfo *this,GlobalHandle dest,string_view destName,string_view destType)

{
  bool bVar1;
  iterator this_00;
  reference __args;
  size_type in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  EndpointInformation *tinfo_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range1_1;
  EndpointInformation *tinfo;
  iterator __end1;
  iterator __begin1;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_> *__range1;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
  *in_stack_ffffffffffffff78;
  size_type *this_01;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff88;
  GlobalHandle in_stack_ffffffffffffff90;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  in_stack_ffffffffffffff98;
  vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
  *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
  local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  size_type local_8;
  
  local_38 = &in_RDI[7].field_2;
  local_8 = in_RSI;
  local_40._M_current =
       (EndpointInformation *)
       std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::begin
                 (in_stack_ffffffffffffff78);
  std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::end
            (in_stack_ffffffffffffff78);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                        *)in_RDI,
                       (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                        *)in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::vector<helics::EndpointInformation,std::allocator<helics::EndpointInformation>>::
      emplace_back<helics::GlobalHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                (in_stack_ffffffffffffffa0,&(in_stack_ffffffffffffff98._M_current)->id,
                 (basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff88);
      this_01 = &in_RDI[8]._M_string_length;
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::size
                ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)&in_RDI[7].field_2);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::reserve((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      std::
      vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::clear((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               *)0x4fb234);
      std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::begin
                ((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  *)this_01);
      this_00 = std::
                vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>::
                end((vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                     *)this_01);
      while (bVar1 = __gnu_cxx::
                     operator==<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                               ((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)in_RDI,
                                (__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                                 *)this_01), ((bVar1 ^ 0xffU) & 1) != 0) {
        __args = __gnu_cxx::
                 __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                 ::operator*((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                              *)&stack0xffffffffffffff98);
        std::
        vector<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<helics::GlobalHandle,std::basic_string_view<char,std::char_traits<char>>>>>
        ::emplace_back<helics::GlobalHandle_const&,std::__cxx11::string_const&>
                  ((vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    *)this_00._M_current,&__args->id,in_RDI);
        __gnu_cxx::
        __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
        ::operator++((__normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
                      *)&stack0xffffffffffffff98);
      }
      return;
    }
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
         ::operator*(&local_40);
    in_stack_ffffffffffffffa8 = local_8;
    bVar1 = GlobalHandle::operator==
                      ((GlobalHandle *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<helics::EndpointInformation_*,_std::vector<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void EndpointInfo::addDestination(GlobalHandle dest,
                                  std::string_view destName,
                                  std::string_view destType)
{
    for (const auto& tinfo : targetInformation) {
        if (tinfo.id == dest) {
            return;
        }
    }
    targetInformation.emplace_back(dest, destName, destType);
    /** now update the target information*/
    targets.reserve(targetInformation.size());
    targets.clear();
    for (const auto& tinfo : targetInformation) {
        targets.emplace_back(tinfo.id, tinfo.key);
    }
}